

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

int xfer_upload_gotpkt(fxp_xfer *xfer,sftp_packet *pktin)

{
  req *prVar1;
  req *prVar2;
  _Bool _Var3;
  sftp_request *req;
  void *ptr;
  _Bool ret;
  req *next;
  req *prev;
  req *rr;
  sftp_request *rreq;
  sftp_packet *pktin_local;
  fxp_xfer *xfer_local;
  
  req = sftp_find_request(pktin);
  if (req == (sftp_request *)0x0) {
    xfer_local._4_4_ = -0x80000000;
  }
  else {
    ptr = fxp_get_userdata(req);
    if (ptr == (void *)0x0) {
      fxp_internal_error("request ID is not part of the current upload");
      xfer_local._4_4_ = -0x80000000;
    }
    else {
      _Var3 = fxp_write_recv(pktin,req);
      prVar1 = *(req **)((long)ptr + 0x28);
      prVar2 = *(req **)((long)ptr + 0x20);
      if (prVar1 == (req *)0x0) {
        xfer->head = prVar2;
      }
      else {
        prVar1->next = prVar2;
      }
      if (prVar2 == (req *)0x0) {
        xfer->tail = prVar1;
      }
      else {
        prVar2->prev = prVar1;
      }
      xfer->req_totalsize = xfer->req_totalsize - *(int *)((long)ptr + 8);
      safefree(ptr);
      if (_Var3) {
        xfer_local._4_4_ = 1;
      }
      else {
        xfer_local._4_4_ = -1;
      }
    }
  }
  return xfer_local._4_4_;
}

Assistant:

int xfer_upload_gotpkt(struct fxp_xfer *xfer, struct sftp_packet *pktin)
{
    struct sftp_request *rreq;
    struct req *rr, *prev, *next;
    bool ret;

    rreq = sftp_find_request(pktin);
    if (!rreq)
        return INT_MIN;            /* this packet doesn't even make sense */
    rr = (struct req *)fxp_get_userdata(rreq);
    if (!rr) {
        fxp_internal_error("request ID is not part of the current upload");
        return INT_MIN;                /* this packet isn't ours */
    }
    ret = fxp_write_recv(pktin, rreq);
#ifdef DEBUG_UPLOAD
    printf("write request %p has returned [%d]\n", rr, ret ? 1 : 0);
#endif

    /*
     * Remove this one from the queue.
     */
    prev = rr->prev;
    next = rr->next;
    if (prev)
        prev->next = next;
    else
        xfer->head = next;
    if (next)
        next->prev = prev;
    else
        xfer->tail = prev;
    xfer->req_totalsize -= rr->len;
    sfree(rr);

    if (!ret)
        return -1;

    return 1;
}